

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O2

void __thiscall
rengine::OpenGLRenderer::drawBlurQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,int radius,vec2 renderSize,vec2 textureSize
          ,vec2 step)

{
  float fVar1;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  activateShader(this,&(this->prog_blur).super_Program);
  ensureMatrixUpdated(this,UpdateBlurProgram,&(this->prog_blur).super_Program);
  glUniform1i((this->prog_blur).radius,radius);
  local_48 = renderSize.x;
  fStack_44 = renderSize.y;
  local_58 = textureSize.x;
  fStack_54 = textureSize.y;
  glUniform4f(local_48,fStack_44,local_58,fStack_54,(this->prog_blur).dims);
  fVar1 = (float)radius * 0.3 + 0.8;
  fVar1 = fVar1 * fVar1;
  glUniform1f(fVar1 + fVar1,(this->prog_blur).sigma);
  local_68 = step.x;
  fStack_64 = step.y;
  glUniform2f(local_68,fStack_64,(this->prog_blur).step);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawBlurQuad(unsigned offset, GLuint texId, int radius, vec2 renderSize, vec2 textureSize, vec2 step)
{
    activateShader(&prog_blur);
    ensureMatrixUpdated(UpdateBlurProgram, &prog_blur);

    glUniform1i(prog_blur.radius, radius);
    glUniform4f(prog_blur.dims, renderSize.x, renderSize.y, textureSize.x, textureSize.y);
    float sigma = 0.3 * radius + 0.8;
    glUniform1f(prog_blur.sigma, sigma * sigma * 2.0);
    glUniform2f(prog_blur.step, step.x, step.y);

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}